

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O0

rbtree_node_base * eastl::RBTreeRotateRight(rbtree_node_base *pNode,rbtree_node_base *pNodeRoot)

{
  this_type *ptVar1;
  rbtree_node_base *pNodeTemp;
  rbtree_node_base *pNodeRoot_local;
  rbtree_node_base *pNode_local;
  
  ptVar1 = pNode->mpNodeLeft;
  pNode->mpNodeLeft = ptVar1->mpNodeRight;
  if (ptVar1->mpNodeRight != (this_type *)0x0) {
    ptVar1->mpNodeRight->mpNodeParent = pNode;
  }
  ptVar1->mpNodeParent = pNode->mpNodeParent;
  pNodeTemp = ptVar1;
  if (pNode != pNodeRoot) {
    if (pNode == pNode->mpNodeParent->mpNodeRight) {
      pNode->mpNodeParent->mpNodeRight = ptVar1;
      pNodeTemp = pNodeRoot;
    }
    else {
      pNode->mpNodeParent->mpNodeLeft = ptVar1;
      pNodeTemp = pNodeRoot;
    }
  }
  ptVar1->mpNodeRight = pNode;
  pNode->mpNodeParent = ptVar1;
  return pNodeTemp;
}

Assistant:

rbtree_node_base* RBTreeRotateRight(rbtree_node_base* pNode, rbtree_node_base* pNodeRoot)
    {
        rbtree_node_base* const pNodeTemp = pNode->mpNodeLeft;

        pNode->mpNodeLeft = pNodeTemp->mpNodeRight;

        if(pNodeTemp->mpNodeRight)
            pNodeTemp->mpNodeRight->mpNodeParent = pNode;
        pNodeTemp->mpNodeParent = pNode->mpNodeParent;

        if(pNode == pNodeRoot)
            pNodeRoot = pNodeTemp;
        else if(pNode == pNode->mpNodeParent->mpNodeRight)
            pNode->mpNodeParent->mpNodeRight = pNodeTemp;
        else
            pNode->mpNodeParent->mpNodeLeft = pNodeTemp;

        pNodeTemp->mpNodeRight = pNode;
        pNode->mpNodeParent = pNodeTemp;

        return pNodeRoot;
    }